

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O2

header_used * __thiscall
first_fit_heap<64UL>::free_list_container::alloc(free_list_container *this,size_t size)

{
  char *pcVar1;
  byte *pbVar2;
  size_t *psVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  iterator this_00;
  ulong uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  header_free *this_01;
  header_used *following;
  header_free *phVar8;
  iterator prev;
  
  sVar5 = 0x40;
  if (0x40 < size) {
    sVar5 = size;
  }
  uVar6 = sVar5 + 0x3f & 0xffffffffffffffc0;
  sVar5 = 0x10;
  if (uVar6 != 0) {
    sVar5 = uVar6;
  }
  prev.block = (header_free *)0x0;
  this_00 = first_free(this,sVar5,&prev);
  if (this_00.block != (header_free *)0x0) {
    uVar6 = (((this_00.block)->super_header_used).raw & 0x3fffffffffffffff) - sVar5;
    if (0x4f < uVar6) {
      header_used::size(&(this_00.block)->super_header_used,sVar5);
      uVar7 = ((this_00.block)->super_header_used).raw & 0x3fffffffffffffff;
      phVar8 = (header_free *)((long)(&(this_00.block)->super_header_used + 1) + uVar7);
      *(ulong *)((long)(&((this_00.block)->super_header_used).
                         super_prepend_alignment_if_greater<16,_64UL> + 1) + uVar7 + 8) = uVar7;
      iVar4 = (*this->mem->_vptr_memory[4])();
      this_01 = (header_free *)0x0;
      if (phVar8 < (header_free *)CONCAT44(extraout_var,iVar4)) {
        this_01 = phVar8;
      }
      header_free::header_free(this_01,uVar6 - 0x40);
      this_01->next_ = (this_00.block)->next_;
      psVar3 = &(this_01->super_header_used).raw;
      *psVar3 = *psVar3 | 0x8000000000000000;
      (this_00.block)->next_ = this_01;
    }
    if (prev.block == (header_free *)0x0) {
      this->list = (this_00.block)->next_;
    }
    else {
      (prev.block)->next_ = (this_00.block)->next_;
    }
    uVar6 = ((this_00.block)->super_header_used).raw & 0x3fffffffffffffff;
    iVar4 = (*this->mem->_vptr_memory[4])();
    if ((long)(&(this_00.block)->super_header_used + 1) + uVar6 < CONCAT44(extraout_var_00,iVar4)) {
      pcVar1 = this_00.block[1].super_header_used.super_prepend_alignment_if_greater<16,_64UL>.
               align_chars + uVar6 + 0x28;
      *(ulong *)pcVar1 = *(ulong *)pcVar1 & 0x7fffffffffffffff;
    }
    pbVar2 = (byte *)((long)&((this_00.block)->super_header_used).raw + 7);
    *pbVar2 = *pbVar2 & 0xbf;
  }
  return &(this_00.block)->super_header_used;
}

Assistant:

header_used *alloc(size_t size)
        {
            size = HEAP_MAX(size, ALIGNMENT);
            size = align(size);

            iterator prev;
            auto it = first_free(size, prev);

            if (it == end()) {
                return nullptr;
            }

            auto  &block          = **it;
            size_t size_remaining = block.size() - size;

            if (size_remaining < (sizeof(header_free) + sizeof(footer))) {
                // remaining size cannot hold another block, use entire space
                size += size_remaining;
            } else {
                // split block into two
                block.size(size);
                block.update_footer();
                auto *new_block = new (block.following_block(mem)) header_free(size_remaining - sizeof(header_used));
                new_block->next(block.next());
                new_block->prev_free(true);
                block.next(new_block);
            }

            if (*prev) {
                (*prev)->next(block.next());
            } else {
                list = block.next();
            }

            auto *following = block.following_block(mem);
            if (following) {
                following->prev_free(false);
            }

            block.is_free(false);
            return &block;
        }